

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O2

void __thiscall XPMP2::SoundSystemFMOD::Update(SoundSystemFMOD *this)

{
  FMOD_RESULT FVar1;
  bool bVar2;
  float fVar3;
  allocator<char> local_133;
  allocator<char> local_132;
  allocator<char> local_131;
  string local_130;
  string local_110;
  string local_f0;
  FMOD_VECTOR normUpw;
  FMOD_VECTOR normForw;
  FmodError local_b0;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  local_40 = DAT_002cc7d8;
  local_38 = DAT_002cc7e0;
  local_50 = DAT_002cc810;
  local_48 = DAT_002cc818;
  FmodNormalizeHeadingPitch(&DAT_002cc7e8,&DAT_002cc7e4);
  FmodHeadPitchRoll2Normal(DAT_002cc7e8,DAT_002cc7e4,DAT_002cc7ec,&normForw,&normUpw);
  gFmodRes = FMOD_System_Set3DListenerAttributes
                       (this->pFmodSystem,0,&local_40,&local_50,&normForw,&normUpw);
  if (gFmodRes != FMOD_OK) {
    if (gFmodRes == FMOD_ERR_INVALID_VECTOR) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"FMOD_System_Set3DListenerAttributes",&local_131);
      FVar1 = gFmodRes;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,
                 "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                 ,&local_132);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"Update",&local_133);
      FmodError::FmodError(&local_b0,&local_f0,FVar1,&local_110,0x1b2,&local_130);
      FmodError::LogErr(&local_b0);
      FmodError::~FmodError(&local_b0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      fVar3 = GetMiscNetwTime();
      if (Update::lastInvVecErrMsgTS + 300.0 <= fVar3) {
        Update::lastInvVecErrMsgTS = GetMiscNetwTime();
        if (glob < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                 ,0x1b5,"Update",logERR,
                 "Please report the following details as a reply to https://bit.ly/LTSound36");
          if (glob < 4) {
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                   ,0x1b7,"Update",logERR,"Camera   roll=%.3f, heading=%.3f, pitch=%.3f",
                   (double)DAT_002cc7ec,(double)DAT_002cc7e4,(double)DAT_002cc7e8);
            if (glob < 4) {
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                     ,0x1b8,"Update",logERR,"normForw x=%.6f, y=%.6f, z=%.6f",(double)normForw.x,
                     (double)normForw.y,(double)normForw.z);
              if (glob < 4) {
                LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                       ,0x1b9,"Update",logERR,"normUpw  x=%.6f, y=%.6f, z=%.6f",(double)normUpw.x,
                       (double)normUpw.y,(double)normUpw.z);
              }
            }
          }
        }
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"FMOD_System_Set3DListenerAttributes",&local_131);
      FVar1 = gFmodRes;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,
                 "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                 ,&local_132);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"Update",&local_133);
      FmodError::FmodError(&local_b0,&local_f0,FVar1,&local_110,0x1ae,&local_130);
      FmodError::LogErr(&local_b0);
      FmodError::~FmodError(&local_b0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
    }
  }
  bVar2 = IsViewExternal();
  SetLowPassGain(this,!bVar2);
  gFmodRes = FMOD_System_Update(this->pFmodSystem);
  if (gFmodRes != FMOD_OK) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"FMOD_System_Update(pFmodSystem)",&local_131);
    FVar1 = gFmodRes;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
               ,&local_132);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"Update",&local_133);
    FmodError::FmodError(&local_b0,&local_f0,FVar1,&local_110,0x1c2,&local_130);
    FmodError::LogErr(&local_b0);
    FmodError::~FmodError(&local_b0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  return;
}

Assistant:

void SoundSystemFMOD::Update ()
{
    // Update the listener position and orientation
    const FMOD_VECTOR posCam   = {
        glob.posCamera.x,
        glob.posCamera.y,
        glob.posCamera.z
    };
    const FMOD_VECTOR velocity  = { glob.vCam_x, glob.vCam_y, glob.vCam_z };
    
    // The forward direction takes heading, pitch, and roll into account
    FmodNormalizeHeadingPitch(glob.posCamera.heading, glob.posCamera.pitch);
    FMOD_VECTOR normForw;
    FMOD_VECTOR normUpw;
    FmodHeadPitchRoll2Normal(glob.posCamera.heading, glob.posCamera.pitch, glob.posCamera.roll, normForw, normUpw);
    
    // FMOD_ERR_INVALID_VECTOR used to be a problem, but should be no longer
    // Still, just in case it comes back, we log more details
    gFmodRes = FMOD_System_Set3DListenerAttributes(pFmodSystem, 0, &posCam, &velocity, &normForw, &normUpw);
    if (gFmodRes != FMOD_OK) {
        if (gFmodRes != FMOD_ERR_INVALID_VECTOR)
            FmodError("FMOD_System_Set3DListenerAttributes", gFmodRes, __FILE__, __LINE__, __func__).LogErr();
        else
        {
            static float lastInvVecErrMsgTS = -500.0f;
            FmodError("FMOD_System_Set3DListenerAttributes", gFmodRes, __FILE__, __LINE__, __func__).LogErr();
            if (GetMiscNetwTime() >= lastInvVecErrMsgTS + 300.0f) {
                lastInvVecErrMsgTS = GetMiscNetwTime();
                LOG_MSG(logERR, "Please report the following details as a reply to https://bit.ly/LTSound36");
                LOG_MSG(logERR, "Camera   roll=%.3f, heading=%.3f, pitch=%.3f",
                        glob.posCamera.roll, glob.posCamera.pitch, glob.posCamera.heading);
                LOG_MSG(logERR, "normForw x=%.6f, y=%.6f, z=%.6f", normForw.x, normForw.y, normForw.z);
                LOG_MSG(logERR, "normUpw  x=%.6f, y=%.6f, z=%.6f", normUpw.x, normUpw.y, normUpw.z);
            }
        }
    }

    // Set low pass gain in case we're in an internal view
    SetLowPassGain(!IsViewExternal());

    // Tell FMOD we're done
    FMOD_LOG(FMOD_System_Update(pFmodSystem));
}